

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall clask::logger::~logger(logger *this)

{
  char *local_28 [4];
  
  this->_vptr_logger = (_func_int **)&PTR__logger_00117b78;
  if (default_level <= (int)this->lv) {
    std::endl<char,std::char_traits<char>>((ostream *)&this->os);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&std::cerr,local_28[0]);
    std::__cxx11::string::~string((string *)local_28);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->os);
  return;
}

Assistant:

inline logger::~logger() {
  if (lv >= logger::level()) {
    os << std::endl;
    std::cerr << os.str().c_str();
  }
}